

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O1

pair<std::optional<CScript>,_std::optional<CScriptWitness>_> * __thiscall
wallet::CCoinControl::GetScripts
          (pair<std::optional<CScript>,_std::optional<CScriptWitness>_> *__return_storage_ptr__,
          CCoinControl *this,COutPoint *outpoint)

{
  long lVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          ::find(&(this->m_selected)._M_t,outpoint);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->m_selected)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->first).super__Optional_base<CScript,_false,_false>._M_payload.
    super__Optional_payload<CScript,_true,_false,_false>.super__Optional_payload_base<CScript>.
    _M_engaged = false;
    (__return_storage_ptr__->second).super__Optional_base<CScriptWitness,_false,_false>._M_payload.
    super__Optional_payload<CScriptWitness,_true,_false,_false>.
    super__Optional_payload_base<CScriptWitness>._M_engaged = false;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_005849ad;
  }
  else {
    pmVar3 = std::
             map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
             ::at(&this->m_selected,outpoint);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_005849ad:
      __stack_chk_fail();
    }
    std::pair<std::optional<CScript>,_std::optional<CScriptWitness>_>::
    pair<std::optional<CScript>,_std::optional<CScriptWitness>,_true>
              (__return_storage_ptr__,&pmVar3->m_script_sig,&pmVar3->m_script_witness);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::optional<CScript>, std::optional<CScriptWitness>> CCoinControl::GetScripts(const COutPoint& outpoint) const
{
    const auto it = m_selected.find(outpoint);
    return it != m_selected.end() ? m_selected.at(outpoint).GetScripts() : std::make_pair(std::nullopt, std::nullopt);
}